

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

index_type *
booster::locale::boundary::details::
mapping_traits<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::random_access_iterator_tag>
::map(index_type *__return_storage_ptr__,boundary_type t,
     __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
     b,__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
       e,locale *l)

{
  boundary_indexing<wchar_t> *pbVar1;
  char_type *begin;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> str;
  undefined1 local_68 [32];
  _Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (b._M_current == e._M_current) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::wstring::
    _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
              ((wstring *)local_68,b._M_current,e._M_current);
    pbVar1 = std::use_facet<booster::locale::boundary::boundary_indexing<wchar_t>>(l);
    (**(code **)(*(long *)pbVar1 + 0x10))
              (&local_48,pbVar1,t,local_68._0_8_,
               (undefined1 *)((long)(size_t *)local_68._0_8_ + local_68._8_8_ * 4));
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish
    ;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~_Vector_base(&local_48);
    std::__cxx11::wstring::~wstring((wstring *)local_68);
  }
  else {
    pbVar1 = std::use_facet<booster::locale::boundary::boundary_indexing<wchar_t>>(l);
    (**(code **)(*(long *)pbVar1 + 0x10))(local_68,pbVar1,t,b._M_current,e._M_current);
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68._16_8_;
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_68._16_8_ = (pointer)0x0;
    std::
    _Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~_Vector_base((_Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        index_type result;

                        //
                        // Optimize for most common cases
                        //
                        // C++0x requires that string is continious in memory and all known
                        // string implementations
                        // do this because of c_str() support. 
                        //

                        if(linear_iterator_traits<char_type,IteratorType>::is_linear && b!=e)
                        {
                            char_type const *begin = &*b;
                            char_type const *end = begin + (e-b);
                            index_type tmp=std::use_facet<boundary_indexing<char_type> >(l).map(t,begin,end);
                            result.swap(tmp);
                        }
                        else {
                            std::basic_string<char_type> str(b,e);
                            index_type tmp = std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                            result.swap(tmp);
                        }
                        return result;
                    }